

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeBroadcastLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  bool bVar1;
  LogMessage *pLVar2;
  mapped_type *pmVar3;
  ShapeRange *pSVar4;
  Type *pTVar5;
  size_t sVar6;
  mapped_type *this_00;
  int iVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_01;
  RangeValue RVar8;
  ShapeRange maxWidth;
  ShapeRange maxHeight;
  ShapeRange maxChannel;
  ShapeRange maxBatch;
  ShapeRange maxSequence;
  undefined1 local_1a0 [24];
  _Alloc_hider _Stack_188;
  ShapeRange local_168;
  undefined1 local_148 [24];
  pointer pcStack_130;
  undefined1 local_128 [24];
  pointer pcStack_110;
  undefined1 local_108 [24];
  pointer pcStack_f0;
  undefined1 local_e8 [24];
  pointer pcStack_d0;
  undefined1 local_c8 [24];
  pointer pcStack_b0;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1a0,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  this_01 = &this->blobShapes;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_01,(key_type *)
                                ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar4 = ShapeConstraint::sequenceRange(pmVar3);
  local_c8._0_8_ = *(undefined8 *)&pSVar4->_minimum;
  local_c8._8_8_ = (pSVar4->_minimum)._val;
  local_c8[0x10] = (pSVar4->_maximum)._isUnbound;
  local_c8._17_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  pcStack_b0 = (pointer)(pSVar4->_maximum)._val;
  pSVar4 = ShapeConstraint::batchRange(pmVar3);
  local_e8._0_8_ = *(undefined8 *)&pSVar4->_minimum;
  local_e8._8_8_ = (pSVar4->_minimum)._val;
  local_e8[0x10] = (pSVar4->_maximum)._isUnbound;
  local_e8._17_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  pcStack_d0 = (pointer)(pSVar4->_maximum)._val;
  pSVar4 = ShapeConstraint::channelRange(pmVar3);
  local_108._0_8_ = *(undefined8 *)&pSVar4->_minimum;
  local_108._8_8_ = (pSVar4->_minimum)._val;
  local_108[0x10] = (pSVar4->_maximum)._isUnbound;
  local_108._17_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  pcStack_f0 = (pointer)(pSVar4->_maximum)._val;
  pSVar4 = ShapeConstraint::heightRange(pmVar3);
  local_128._0_8_ = *(undefined8 *)&pSVar4->_minimum;
  local_128._8_8_ = (pSVar4->_minimum)._val;
  local_128[0x10] = (pSVar4->_maximum)._isUnbound;
  local_128._17_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  pcStack_110 = (pointer)(pSVar4->_maximum)._val;
  pSVar4 = ShapeConstraint::widthRange(pmVar3);
  local_148._0_8_ = *(undefined8 *)&pSVar4->_minimum;
  local_148._8_8_ = (pSVar4->_minimum)._val;
  local_148[0x10] = (pSVar4->_maximum)._isUnbound;
  local_148._17_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  pcStack_130 = (pointer)(pSVar4->_maximum)._val;
  bVar1 = ShapeConstraint::hasFixedCHW(pmVar3);
  if (1 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_) {
    iVar7 = 1;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(specLayer->input_).super_RepeatedPtrFieldBase,iVar7);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](this_01,pTVar5);
      if (bVar1 == false) {
        bVar1 = false;
      }
      else {
        bVar1 = ShapeConstraint::hasFixedCHW(pmVar3);
      }
      pSVar4 = ShapeConstraint::sequenceRange(pmVar3);
      ShapeRange::intersect((ShapeRange *)local_1a0,(ShapeRange *)local_c8,pSVar4);
      local_c8._16_8_ = local_1a0._16_8_;
      pcStack_b0 = _Stack_188._M_p;
      local_c8._0_8_ = local_1a0._0_8_;
      local_c8._8_8_ = local_1a0._8_8_;
      pSVar4 = ShapeConstraint::batchRange(pmVar3);
      ShapeRange::intersect((ShapeRange *)local_1a0,(ShapeRange *)local_e8,pSVar4);
      local_e8._16_8_ = local_1a0._16_8_;
      pcStack_d0 = _Stack_188._M_p;
      local_e8._0_8_ = local_1a0._0_8_;
      local_e8._8_8_ = local_1a0._8_8_;
      pSVar4 = ShapeConstraint::channelRange(pmVar3);
      ShapeRange::unify((ShapeRange *)local_1a0,(ShapeRange *)local_108,pSVar4);
      local_108._16_8_ = local_1a0._16_8_;
      pcStack_f0 = _Stack_188._M_p;
      local_108._0_8_ = local_1a0._0_8_;
      local_108._8_8_ = local_1a0._8_8_;
      pSVar4 = ShapeConstraint::heightRange(pmVar3);
      ShapeRange::unify((ShapeRange *)local_1a0,(ShapeRange *)local_128,pSVar4);
      local_128._16_8_ = local_1a0._16_8_;
      pcStack_110 = _Stack_188._M_p;
      local_128._0_8_ = local_1a0._0_8_;
      local_128._8_8_ = local_1a0._8_8_;
      pSVar4 = ShapeConstraint::widthRange(pmVar3);
      ShapeRange::unify((ShapeRange *)local_1a0,(ShapeRange *)local_148,pSVar4);
      local_148._0_8_ = local_1a0._0_8_;
      local_148._8_8_ = local_1a0._8_8_;
      local_148._16_8_ = local_1a0._16_8_;
      pcStack_130 = _Stack_188._M_p;
      iVar7 = iVar7 + 1;
    } while (iVar7 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1a0,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_01,(key_type *)
                                ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0])
  ;
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_1a0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_168,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1a0);
  }
  ShapeConstraint::setName
            (pmVar3,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar4 = ShapeConstraint::sequenceRange(pmVar3);
  ShapeRange::intersect(&local_168,pSVar4,(ShapeRange *)local_c8);
  ShapeConstraint::updateSequenceRange(pmVar3,&local_168);
  pSVar4 = ShapeConstraint::batchRange(pmVar3);
  ShapeRange::intersect(&local_168,pSVar4,(ShapeRange *)local_e8);
  ShapeConstraint::updateBatchRange(pmVar3,&local_168);
  if (bVar1 == false) {
    pSVar4 = ShapeConstraint::channelRange(pmVar3);
    ShapeRange::intersect(&local_168,pSVar4,(ShapeRange *)local_108);
    ShapeConstraint::updateChannelRange(pmVar3,&local_168);
    pSVar4 = ShapeConstraint::heightRange(pmVar3);
    ShapeRange::intersect(&local_168,pSVar4,(ShapeRange *)local_128);
    ShapeConstraint::updateHeightRange(pmVar3,&local_168);
    pSVar4 = ShapeConstraint::widthRange(pmVar3);
    ShapeRange::intersect(&local_168,pSVar4,(ShapeRange *)local_148);
    ShapeConstraint::updateWidthRange(pmVar3,&local_168);
  }
  else {
    RVar8 = ShapeRange::maximum((ShapeRange *)local_108);
    local_168._minimum._val = RVar8._val;
    local_168._minimum._isUnbound = RVar8._isUnbound;
    sVar6 = RangeValue::value(&local_168._minimum);
    ShapeConstraint::setChannel(pmVar3,sVar6);
    RVar8 = ShapeRange::maximum((ShapeRange *)local_128);
    local_168._minimum._val = RVar8._val;
    local_168._minimum._isUnbound = RVar8._isUnbound;
    sVar6 = RangeValue::value(&local_168._minimum);
    ShapeConstraint::setHeight(pmVar3,sVar6);
    RVar8 = ShapeRange::maximum((ShapeRange *)local_148);
    local_168._minimum._val = RVar8._val;
    local_168._minimum._isUnbound = RVar8._isUnbound;
    sVar6 = RangeValue::value(&local_168._minimum);
    ShapeConstraint::setWidth(pmVar3,sVar6);
  }
  if (0 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_) {
    iVar7 = 0;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(specLayer->input_).super_RepeatedPtrFieldBase,iVar7);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::operator[](this_01,pTVar5);
      pSVar4 = ShapeConstraint::sequenceRange(pmVar3);
      ShapeConstraint::updateSequenceRange(this_00,pSVar4);
      pSVar4 = ShapeConstraint::batchRange(pmVar3);
      ShapeConstraint::updateBatchRange(this_00,pSVar4);
      bVar1 = ShapeConstraint::hasFixedCHW(this_00);
      if (!bVar1) {
        pSVar4 = ShapeConstraint::channelRange(pmVar3);
        ShapeConstraint::updateChannelRange(this_00,pSVar4);
        pSVar4 = ShapeConstraint::heightRange(pmVar3);
        ShapeConstraint::updateHeightRange(this_00,pSVar4);
        pSVar4 = ShapeConstraint::widthRange(pmVar3);
        ShapeConstraint::updateWidthRange(this_00,pSVar4);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeBroadcastLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& maxShape = blobShapes[specLayer.input(0)];

    ShapeRange maxSequence = maxShape.sequenceRange();
    ShapeRange maxBatch = maxShape.batchRange();
    ShapeRange maxChannel = maxShape.channelRange();
    ShapeRange maxHeight = maxShape.heightRange();
    ShapeRange maxWidth = maxShape.widthRange();

    bool inputShapesFixed = maxShape.hasFixedCHW();

    for (int i = 1; i < specLayer.input_size(); i++) {

        ShapeConstraint& inShape = blobShapes[specLayer.input(i)];

        inputShapesFixed = inputShapesFixed && inShape.hasFixedCHW();

        maxSequence = maxSequence.intersect(inShape.sequenceRange());
        maxBatch = maxBatch.intersect(inShape.batchRange());

        maxChannel = maxChannel.unify(inShape.channelRange());
        maxHeight = maxHeight.unify(inShape.heightRange());
        maxWidth = maxWidth.unify(inShape.widthRange());

    }

    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Broadcast layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Broadcast layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    // Can there be ambiguity in the output of one of these? Yes.

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(maxSequence));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(maxBatch));

    if (inputShapesFixed) {
        outputShape.setChannel(maxChannel.maximum().value());
        outputShape.setHeight(maxHeight.maximum().value());
        outputShape.setWidth(maxWidth.maximum().value());
    }
    else {
        outputShape.updateChannelRange(outputShape.channelRange().intersect(maxChannel));
        outputShape.updateHeightRange(outputShape.heightRange().intersect(maxHeight));
        outputShape.updateWidthRange(outputShape.widthRange().intersect(maxWidth));
    }

    for (int i = 0; i < specLayer.input_size(); i++) {

        ShapeConstraint& inShape = blobShapes[specLayer.input(i)];
        inShape.updateSequenceRange(outputShape.sequenceRange());
        inShape.updateBatchRange(outputShape.batchRange());

        // Load constant followed by broadcast is a common pattern. If one of the inputs was from a
        // load constant layer, it will have a fixed shape, so we don't need to update shape information
        // in this case.

        if (!inShape.hasFixedCHW()) {
            inShape.updateChannelRange(outputShape.channelRange());
            inShape.updateHeightRange(outputShape.heightRange());
            inShape.updateWidthRange(outputShape.widthRange());
        }

    }


#if COREML_VALIDATOR_VERBOSE
    std::cout << "Broadcast layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Broadcast layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}